

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_b0 [4];
  int mode;
  mpt_stream srm;
  char **argv_local;
  int argc_local;
  
  srm._wd._enc = (mpt_data_encoder_t)argv;
  memset(local_b0,0,0x98);
  srm._rd._state.data.len = 0xffffffffffffffff;
  if (argc < 2) {
    fprintf(_stderr,"%s %s [%s]\n",*(undefined8 *)srm._wd._enc,"<executable>","<args>");
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = mpt_stream_pipe(local_b0,*(undefined8 *)(srm._wd._enc + 8),srm._wd._enc + 8);
    if (iVar1 < 0) {
      perror("call");
      argv_local._4_4_ = 1;
    }
    else {
      mpt_stream_setmode(local_b0,0x30);
      while( true ) {
        iVar1 = mpt_stream_poll(local_b0,0x11,0xffffffff);
        if (iVar1 < 1) break;
        fprintf(_stderr,"%d (%d)\n",(ulong)srm._rd.data.base & 0xffffffff,
                srm._rd.data.len & 0xffffffff);
      }
      fwrite((void *)srm._info._fd,(size_t)srm._rd.data.base,1,_stdout);
      mpt_stream_close(local_b0);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * const argv[])
{
	struct mpt_stream srm = MPT_STREAM_INIT;
	int mode;
	
	if (argc < 2) {
		fprintf(stderr, "%s %s [%s]\n", *argv, "<executable>", "<args>");
		return 1;
	}
	if ((mode = mpt_stream_pipe(&srm._info, argv[1], argv+1)) < 0) {
		perror("call");
		return 1;
	}
	mpt_stream_setmode(&srm, MPT_ENUM(StreamBuffer));
	
	while (mpt_stream_poll(&srm, POLLIN | POLLHUP, -1) > 0) {
		fprintf(stderr, "%d (%d)\n", (int) srm._rd.data.len, (int) srm._rd.data.max);
	}
	fwrite(srm._rd.data.base, srm._rd.data.len, 1, stdout);
	mpt_stream_close(&srm);
	return 0;
}